

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu.cpp
# Opt level: O3

int __thiscall ncnn::PReLU::load_model(PReLU *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  int iVar3;
  void *local_48;
  int *local_40;
  size_t local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  size_t local_20;
  
  (**mb->_vptr_ModelBin)(&local_48,mb,(ulong)(uint)this->num_slope,1);
  pMVar1 = &this->slope_data;
  if (pMVar1 != (Mat *)&local_48) {
    if (local_40 != (int *)0x0) {
      LOCK();
      *local_40 = *local_40 + 1;
      UNLOCK();
    }
    piVar2 = (this->slope_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (pMVar1->data != (void *)0x0)) {
        free(*(void **)((long)pMVar1->data + -8));
      }
    }
    (this->slope_data).data = local_48;
    (this->slope_data).refcount = local_40;
    (this->slope_data).elemsize = local_38;
    (this->slope_data).dims = (undefined4)local_30;
    (this->slope_data).w = local_30._4_4_;
    (this->slope_data).h = (undefined4)uStack_28;
    (this->slope_data).c = uStack_28._4_4_;
    (this->slope_data).cstep = local_20;
  }
  if (local_40 != (int *)0x0) {
    LOCK();
    *local_40 = *local_40 + -1;
    UNLOCK();
    if ((*local_40 == 0) && (local_48 != (void *)0x0)) {
      free(*(void **)((long)local_48 + -8));
    }
  }
  if ((pMVar1->data == (void *)0x0) ||
     (iVar3 = 0, (long)(this->slope_data).c * (this->slope_data).cstep == 0)) {
    iVar3 = -100;
  }
  return iVar3;
}

Assistant:

int PReLU::load_model(const ModelBin& mb)
{
    slope_data = mb.load(num_slope, 1);
    if (slope_data.empty())
        return -100;

    return 0;
}